

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatrixDynSize.cpp
# Opt level: O3

void __thiscall
iDynTree::MatrixDynSize::MatrixDynSize(MatrixDynSize *this,MatrixView<const_double> *other)

{
  MatrixStorageOrdering MVar1;
  size_t sVar2;
  size_t sVar3;
  pointer peVar4;
  long lVar5;
  size_t sVar6;
  ulong uVar7;
  double *pdVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  
  this->_vptr_MatrixDynSize = (_func_int **)&PTR__MatrixDynSize_0015ec68;
  sVar2 = other->m_rows;
  this->m_rows = sVar2;
  sVar3 = other->m_cols;
  this->m_cols = sVar3;
  uVar7 = sVar3 * sVar2;
  if (uVar7 == 0) {
    this->m_capacity = 0;
    this->m_data = (double *)0x0;
  }
  else {
    this->m_capacity = uVar7;
    pdVar8 = (double *)operator_new__(-(ulong)(uVar7 >> 0x3d != 0) | uVar7 * 8);
    this->m_data = pdVar8;
    if (sVar2 != 0) {
      sVar9 = 0;
      do {
        if (sVar3 != 0) {
          peVar4 = other->m_storage;
          MVar1 = other->m_storageOrder;
          lVar5 = other->m_outerStride;
          sVar10 = 0;
          do {
            sVar11 = sVar9;
            sVar6 = sVar10;
            if (MVar1 == RowMajor) {
              sVar11 = sVar10;
              sVar6 = sVar9;
            }
            pdVar8[sVar10] = peVar4[sVar6 * lVar5 + sVar11];
            sVar10 = sVar10 + 1;
          } while (sVar3 != sVar10);
        }
        sVar9 = sVar9 + 1;
        pdVar8 = pdVar8 + sVar3;
      } while (sVar9 != sVar2);
    }
  }
  return;
}

Assistant:

MatrixDynSize::MatrixDynSize(MatrixView<const double> other) : m_rows(other.rows()),
                                                                      m_cols(other.cols())
{
    if( this->m_rows*this->m_cols == 0 )
    {
        this->m_capacity = 0;
        this->m_data = 0;
    }
    else
    {
        this->m_capacity = this->m_rows*this->m_cols;
        this->m_data = new double[this->m_capacity];

        // copy the matrix
        for(std::size_t i = 0; i < m_rows; i++)
        {
            for(std::size_t j = 0; j < m_cols; j++)
            {
                this->m_data[this->rawIndexRowMajor(i,j)] = other(i, j);
            }
        }
    }
}